

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxPortFactory.cpp
# Opt level: O1

string * __thiscall
LinuxPortFactory::next_abi_cxx11_(string *__return_storage_ptr__,LinuxPortFactory *this)

{
  int iVar1;
  dirent *pdVar2;
  size_t sVar3;
  char *__s2;
  
  if (this->_dir == (DIR *)0x0) {
LAB_0010fa8e:
    (*(this->super_PortFactoryBase)._vptr_PortFactoryBase[3])(__return_storage_ptr__,this);
  }
  else {
    do {
      pdVar2 = readdir((DIR *)this->_dir);
      if (pdVar2 == (dirent *)0x0) goto LAB_0010fa8e;
      __s2 = pdVar2->d_name;
      iVar1 = strncmp("ttyUSB",__s2,6);
    } while (((iVar1 != 0) && (iVar1 = strncmp("ttyACM",__s2,6), iVar1 != 0)) &&
            (iVar1 = strncmp("ttyS",__s2,4), iVar1 != 0));
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar3 = strlen(__s2);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__s2,__s2 + sVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
LinuxPortFactory::next()
{
    struct dirent* entry;

    if (!_dir)
        return end();

    while ((entry = readdir(_dir)))
    {
        if (strncmp("ttyUSB", entry->d_name, sizeof("ttyUSB") - 1) == 0)
            return std::string(entry->d_name);
        else if (strncmp("ttyACM", entry->d_name, sizeof("ttyACM") - 1) == 0)
            return std::string(entry->d_name);
        else if (strncmp("ttyS", entry->d_name, sizeof("ttyS") - 1) == 0)
            return std::string(entry->d_name);
    }

    return end();
}